

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O2

void * lj_alloc_malloc(void *msp,size_t nsize)

{
  ulong *puVar1;
  byte *pbVar2;
  long lVar3;
  void *pvVar4;
  undefined1 (*addr) [16];
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  void *pvVar8;
  ulong *puVar9;
  msegmentptr pmVar10;
  ulong uVar11;
  size_t dvs;
  ulong uVar12;
  undefined1 (*pauVar13) [16];
  long lVar14;
  uint uVar15;
  undefined1 (*pauVar16) [16];
  undefined8 *puVar17;
  long *plVar18;
  uint uVar19;
  ulong uVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  undefined8 *puVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  if (nsize < 0xf1) {
    uVar11 = 0x20;
    if (0x16 < nsize) {
      uVar11 = (ulong)((int)nsize + 0xfU & 0x1f8);
    }
    uVar15 = *msp;
    bVar21 = (byte)(uVar11 >> 3);
    uVar19 = uVar15 >> (bVar21 & 0x1f);
    if ((uVar19 & 3) != 0) {
      uVar19 = (~uVar19 & 1) + (int)(uVar11 >> 3);
      lVar6 = (long)msp + (ulong)(uVar19 * 0x10) + 0x38;
      lVar26 = *(long *)((long)msp + (ulong)(uVar19 * 0x10) + 0x48);
      lVar14 = *(long *)(lVar26 + 0x10);
      if (lVar6 == lVar14) {
        *(uint *)msp = uVar15 & ~(1 << (uVar19 & 0x1f));
      }
      else {
        *(long *)((long)msp + (ulong)(uVar19 * 0x10) + 0x48) = lVar14;
        *(long *)(lVar14 + 0x18) = lVar6;
      }
      *(ulong *)(lVar26 + 8) = (ulong)(uVar19 * 8) + 3;
      pbVar2 = (byte *)(lVar26 + 8 + (ulong)(uVar19 * 8));
      *pbVar2 = *pbVar2 | 1;
      return (void *)(lVar26 + 0x10);
    }
    uVar12 = *(ulong *)((long)msp + 8);
    if (uVar12 < uVar11) {
      if (uVar15 >> (bVar21 & 0x1f) != 0) {
        uVar22 = 2 << (bVar21 & 0x1f);
        uVar22 = (-uVar22 | uVar22) & uVar19 << (bVar21 & 0x1f);
        uVar19 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        uVar22 = uVar19 << 4;
        lVar6 = (long)msp + (ulong)uVar22 + 0x38;
        lVar26 = *(long *)((long)msp + (ulong)uVar22 + 0x48);
        lVar14 = *(long *)(lVar26 + 0x10);
        if (lVar6 == lVar14) {
          uVar15 = uVar15 & ~(1 << (uVar19 & 0x1f));
          *(uint *)msp = uVar15;
        }
        else {
          *(long *)((long)msp + (ulong)uVar22 + 0x48) = lVar14;
          *(long *)(lVar14 + 0x18) = lVar6;
        }
        uVar23 = (ulong)(uVar19 * 8);
        uVar20 = uVar23 - uVar11;
        if (0x1f < uVar20) {
          *(ulong *)(lVar26 + 8) = uVar11 | 3;
          *(ulong *)(lVar26 + 8 + uVar11) = uVar20 | 1;
          *(ulong *)(lVar26 + uVar23) = uVar20;
          if (uVar12 != 0) {
            lVar14 = *(long *)((long)msp + 0x18);
            uVar12 = uVar12 >> 3;
            lVar6 = (long)msp + uVar12 * 0x10 + 0x38;
            if ((uVar15 >> ((uint)uVar12 & 0x1f) & 1) == 0) {
              *(uint *)msp = uVar15 | 1 << ((byte)uVar12 & 0x1f);
              lVar25 = lVar6;
            }
            else {
              lVar25 = *(long *)(lVar6 + 0x10);
            }
            *(long *)(lVar6 + 0x10) = lVar14;
            *(long *)(lVar25 + 0x18) = lVar14;
            *(long *)(lVar14 + 0x10) = lVar25;
            *(long *)(lVar14 + 0x18) = lVar6;
          }
          *(ulong *)((long)msp + 8) = uVar20;
          *(ulong *)((long)msp + 0x18) = lVar26 + uVar11;
          return (void *)(lVar26 + 0x10);
        }
        *(ulong *)(lVar26 + 8) = uVar23 | 3;
        pbVar2 = (byte *)(lVar26 + 8 + uVar23);
        *pbVar2 = *pbVar2 | 1;
        return (void *)(lVar26 + 0x10);
      }
      uVar19 = *(uint *)((long)msp + 4);
      if (uVar19 != 0) {
        uVar22 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        lVar14 = *(long *)((long)msp + (ulong)uVar22 * 8 + 0x248);
        uVar20 = (*(ulong *)(lVar14 + 8) & 0xfffffffffffffffc) - uVar11;
        lVar26 = lVar14;
        while ((lVar6 = *(long *)(lVar26 + 0x20), lVar6 != 0 ||
               (lVar6 = *(long *)(lVar26 + 0x28), lVar6 != 0))) {
          uVar23 = (*(ulong *)(lVar6 + 8) & 0xfffffffffffffffc) - uVar11;
          lVar26 = lVar6;
          if (uVar23 < uVar20) {
            lVar14 = lVar6;
            uVar20 = uVar23;
          }
        }
        lVar26 = *(long *)(lVar14 + 0x18);
        lVar6 = *(long *)(lVar14 + 0x30);
        if (lVar26 == lVar14) {
          if (*(long *)(lVar14 + 0x28) == 0) {
            if (*(long *)(lVar14 + 0x20) == 0) {
              lVar26 = 0;
              goto LAB_0014de2e;
            }
            lVar25 = *(long *)(lVar14 + 0x20);
            puVar17 = (undefined8 *)(lVar14 + 0x20);
          }
          else {
            lVar25 = *(long *)(lVar14 + 0x28);
            puVar17 = (undefined8 *)(lVar14 + 0x28);
          }
          do {
            do {
              puVar24 = puVar17;
              lVar26 = lVar25;
              lVar25 = *(long *)(lVar26 + 0x28);
              puVar17 = (undefined8 *)(lVar26 + 0x28);
            } while (*(long *)(lVar26 + 0x28) != 0);
            lVar25 = *(long *)(lVar26 + 0x20);
            puVar17 = (undefined8 *)(lVar26 + 0x20);
          } while (*(long *)(lVar26 + 0x20) != 0);
          *puVar24 = 0;
        }
        else {
          lVar25 = *(long *)(lVar14 + 0x10);
          *(long *)(lVar25 + 0x18) = lVar26;
          *(long *)(lVar26 + 0x10) = lVar25;
        }
LAB_0014de2e:
        if (lVar6 != 0) {
          lVar25 = *(long *)(lVar14 + 0x38);
          if (lVar14 == *(long *)((long)msp + lVar25 * 8 + 0x248)) {
            *(long *)((long)msp + lVar25 * 8 + 0x248) = lVar26;
            if (lVar26 != 0) goto LAB_0014de63;
            *(uint *)((long)msp + 4) = uVar19 & ~(1 << ((uint)lVar25 & 0x1f));
          }
          else {
            *(long *)(lVar6 + 0x20 + (ulong)(*(long *)(lVar6 + 0x20) != lVar14) * 8) = lVar26;
            if (lVar26 != 0) {
LAB_0014de63:
              *(long *)(lVar26 + 0x30) = lVar6;
              lVar6 = *(long *)(lVar14 + 0x20);
              if (lVar6 != 0) {
                *(long *)(lVar26 + 0x20) = lVar6;
                *(long *)(lVar6 + 0x30) = lVar26;
              }
              lVar6 = *(long *)(lVar14 + 0x28);
              if (lVar6 != 0) {
                *(long *)(lVar26 + 0x28) = lVar6;
                *(long *)(lVar6 + 0x30) = lVar26;
              }
            }
          }
        }
        if (uVar20 < 0x20) {
          *(ulong *)(lVar14 + 8) = uVar20 + uVar11 | 3;
          pbVar2 = (byte *)(lVar14 + 8 + uVar20 + uVar11);
          *pbVar2 = *pbVar2 | 1;
        }
        else {
          *(ulong *)(lVar14 + 8) = uVar11 | 3;
          *(ulong *)(lVar14 + 8 + uVar11) = uVar20 | 1;
          *(ulong *)(lVar14 + uVar11 + uVar20) = uVar20;
          if (uVar12 != 0) {
            lVar26 = *(long *)((long)msp + 0x18);
            uVar12 = uVar12 >> 3;
            lVar6 = (long)msp + uVar12 * 0x10 + 0x38;
            if ((uVar15 >> ((uint)uVar12 & 0x1f) & 1) == 0) {
              *(uint *)msp = 1 << ((byte)uVar12 & 0x1f) | uVar15;
              lVar25 = lVar6;
            }
            else {
              lVar25 = *(long *)((long)msp + uVar12 * 0x10 + 0x48);
            }
            *(long *)((long)msp + uVar12 * 0x10 + 0x48) = lVar26;
            *(long *)(lVar25 + 0x18) = lVar26;
            *(long *)(lVar26 + 0x10) = lVar25;
            *(long *)(lVar26 + 0x18) = lVar6;
          }
          *(ulong *)((long)msp + 8) = uVar20;
          *(ulong *)((long)msp + 0x18) = lVar14 + uVar11;
        }
        goto LAB_0014e024;
      }
    }
  }
  else if (nsize < 0xffffffffffffff80) {
    uVar11 = nsize + 0xf & 0xfffffffffffffff8;
    uVar15 = *(uint *)((long)msp + 4);
    if (uVar15 != 0) {
      uVar19 = (uint)(nsize + 0xf >> 8);
      if (uVar19 == 0) {
        uVar12 = 0;
      }
      else if (uVar19 < 0x10000) {
        uVar22 = 0x1f;
        if (uVar19 != 0) {
          for (; uVar19 >> uVar22 == 0; uVar22 = uVar22 - 1) {
          }
        }
        uVar12 = (ulong)((uVar11 >> ((ulong)(byte)(0x26 - (char)(uVar22 ^ 0x1f)) & 0x3f) & 1) != 0)
                 | (ulong)((uVar22 ^ 0x1f) * 2 ^ 0x3e);
      }
      else {
        uVar12 = 0x1f;
      }
      uVar20 = -uVar11;
      lVar26 = *(long *)((long)msp + uVar12 * 8 + 0x248);
      if (lVar26 == 0) {
        lVar6 = 0;
        lVar14 = 0;
      }
      else {
        bVar21 = 0x39 - (char)(uVar12 >> 1);
        if (uVar12 == 0x1f) {
          bVar21 = 0;
        }
        lVar25 = uVar11 << (bVar21 & 0x3f);
        lVar6 = 0;
        lVar7 = 0;
        do {
          lVar14 = lVar26;
          uVar23 = (*(ulong *)(lVar14 + 8) & 0xfffffffffffffffc) - uVar11;
          if ((uVar23 < uVar20) && (lVar7 = lVar14, uVar20 = uVar23, uVar23 == 0)) {
            uVar20 = 0;
            lVar6 = lVar14;
            goto LAB_0014e6bc;
          }
          lVar3 = *(long *)(lVar14 + 0x28);
          lVar26 = *(long *)(lVar14 + 0x20 + (lVar25 >> 0x3f) * -8);
          lVar14 = lVar3;
          if (lVar3 == lVar26) {
            lVar14 = lVar6;
          }
          if (lVar3 != 0) {
            lVar6 = lVar14;
          }
          lVar25 = lVar25 * 2;
          lVar14 = lVar7;
        } while (lVar26 != 0);
      }
      if (lVar6 != 0 || lVar14 != 0) goto LAB_0014e6bc;
      uVar19 = 2 << ((byte)uVar12 & 0x1f);
      uVar19 = (-uVar19 | uVar19) & uVar15;
      if (uVar19 == 0) {
        lVar14 = 0;
        lVar6 = 0;
        goto LAB_0014e6bc;
      }
      uVar22 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      plVar18 = (long *)((long)msp + (ulong)uVar22 * 8 + 0x248);
      lVar14 = 0;
LAB_0014e6b9:
      lVar6 = *plVar18;
LAB_0014e6bc:
      while (lVar26 = lVar6, lVar26 != 0) {
        uVar12 = (*(ulong *)(lVar26 + 8) & 0xfffffffffffffffc) - uVar11;
        bVar27 = uVar12 < uVar20;
        if (bVar27) {
          uVar20 = uVar12;
        }
        if (bVar27) {
          lVar14 = lVar26;
        }
        lVar6 = *(long *)(lVar26 + 0x20);
        if (*(long *)(lVar26 + 0x20) == 0) goto code_r0x0014e6e3;
      }
      if ((lVar14 == 0) || (*(long *)((long)msp + 8) - uVar11 <= uVar20)) goto LAB_0014df2d;
      lVar26 = *(long *)(lVar14 + 0x18);
      lVar6 = *(long *)(lVar14 + 0x30);
      if (lVar26 != lVar14) {
        lVar25 = *(long *)(lVar14 + 0x10);
        *(long *)(lVar25 + 0x18) = lVar26;
        *(long *)(lVar26 + 0x10) = lVar25;
        goto LAB_0014e761;
      }
      if (*(long *)(lVar14 + 0x28) != 0) {
        lVar25 = *(long *)(lVar14 + 0x28);
        puVar17 = (undefined8 *)(lVar14 + 0x28);
        goto LAB_0014e73d;
      }
      if (*(long *)(lVar14 + 0x20) == 0) {
        lVar26 = 0;
      }
      else {
        lVar25 = *(long *)(lVar14 + 0x20);
        puVar17 = (undefined8 *)(lVar14 + 0x20);
LAB_0014e73d:
        do {
          do {
            puVar24 = puVar17;
            lVar26 = lVar25;
            lVar25 = *(long *)(lVar26 + 0x28);
            puVar17 = (undefined8 *)(lVar26 + 0x28);
          } while (*(long *)(lVar26 + 0x28) != 0);
          lVar25 = *(long *)(lVar26 + 0x20);
          puVar17 = (undefined8 *)(lVar26 + 0x20);
        } while (*(long *)(lVar26 + 0x20) != 0);
        *puVar24 = 0;
      }
LAB_0014e761:
      if (lVar6 != 0) {
        lVar25 = *(long *)(lVar14 + 0x38);
        if (lVar14 == *(long *)((long)msp + lVar25 * 8 + 0x248)) {
          *(long *)((long)msp + lVar25 * 8 + 0x248) = lVar26;
          if (lVar26 != 0) goto LAB_0014e790;
          *(uint *)((long)msp + 4) = uVar15 & ~(1 << ((uint)lVar25 & 0x1f));
        }
        else {
          *(long *)(lVar6 + 0x20 + (ulong)(*(long *)(lVar6 + 0x20) != lVar14) * 8) = lVar26;
          if (lVar26 != 0) {
LAB_0014e790:
            *(long *)(lVar26 + 0x30) = lVar6;
            lVar6 = *(long *)(lVar14 + 0x20);
            if (lVar6 != 0) {
              *(long *)(lVar26 + 0x20) = lVar6;
              *(long *)(lVar6 + 0x30) = lVar26;
            }
            lVar6 = *(long *)(lVar14 + 0x28);
            if (lVar6 != 0) {
              *(long *)(lVar26 + 0x28) = lVar6;
              *(long *)(lVar6 + 0x30) = lVar26;
            }
          }
        }
      }
      if (uVar20 < 0x20) {
        *(ulong *)(lVar14 + 8) = uVar20 + uVar11 | 3;
        pbVar2 = (byte *)(lVar14 + 8 + uVar20 + uVar11);
        *pbVar2 = *pbVar2 | 1;
      }
      else {
        lVar26 = lVar14 + uVar11;
        *(ulong *)(lVar14 + 8) = uVar11 | 3;
        *(ulong *)(lVar14 + 8 + uVar11) = uVar20 | 1;
        *(ulong *)(lVar26 + uVar20) = uVar20;
        if (uVar20 < 0x100) {
          uVar20 = uVar20 >> 3;
          lVar6 = (long)msp + uVar20 * 0x10 + 0x38;
          if ((*msp >> ((uint)uVar20 & 0x1f) & 1) == 0) {
            *(uint *)msp = *msp | 1 << ((byte)uVar20 & 0x1f);
            lVar25 = lVar6;
          }
          else {
            lVar25 = *(long *)((long)msp + uVar20 * 0x10 + 0x48);
          }
          *(long *)((long)msp + uVar20 * 0x10 + 0x48) = lVar26;
          *(long *)(lVar25 + 0x18) = lVar26;
          *(long *)(lVar26 + 0x10) = lVar25;
          *(long *)(lVar26 + 0x18) = lVar6;
        }
        else {
          uVar15 = (uint)(uVar20 >> 8);
          if (uVar15 == 0) {
            uVar11 = 0;
          }
          else if (uVar15 < 0x10000) {
            uVar19 = 0x1f;
            if (uVar15 != 0) {
              for (; uVar15 >> uVar19 == 0; uVar19 = uVar19 - 1) {
              }
            }
            uVar11 = (ulong)((uint)((uVar20 >> ((ulong)(byte)(0x26 - (char)(uVar19 ^ 0x1f)) & 0x3f)
                                    & 1) != 0) | (uVar19 ^ 0x1f) * 2 ^ 0x3e);
          }
          else {
            uVar11 = 0x1f;
          }
          plVar18 = (long *)((long)msp + uVar11 * 8 + 0x248);
          *(ulong *)(lVar26 + 0x38) = uVar11;
          *(undefined1 (*) [16])(lVar26 + 0x20) = (undefined1  [16])0x0;
          if ((*(uint *)((long)msp + 4) >> ((uint)uVar11 & 0x1f) & 1) == 0) {
            *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar11 & 0x1f);
            *plVar18 = lVar26;
            *(long **)(lVar26 + 0x30) = plVar18;
          }
          else {
            bVar21 = 0x39 - (char)(uVar11 >> 1);
            if (uVar11 == 0x1f) {
              bVar21 = 0;
            }
            lVar25 = uVar20 << (bVar21 & 0x3f);
            lVar6 = *plVar18;
            do {
              lVar7 = lVar6;
              if ((*(ulong *)(lVar7 + 8) & 0xfffffffffffffffc) == uVar20) {
                lVar6 = *(long *)(lVar7 + 0x10);
                *(long *)(lVar6 + 0x18) = lVar26;
                *(long *)(lVar7 + 0x10) = lVar26;
                *(long *)(lVar26 + 0x10) = lVar6;
                *(long *)(lVar26 + 0x18) = lVar7;
                *(undefined8 *)(lVar26 + 0x30) = 0;
                goto LAB_0014e024;
              }
              lVar3 = lVar25 >> 0x3f;
              lVar25 = lVar25 * 2;
              lVar6 = *(long *)(lVar7 + 0x20 + lVar3 * -8);
            } while (lVar6 != 0);
            *(long *)(lVar7 + 0x20 + lVar3 * -8) = lVar26;
            *(long *)(lVar26 + 0x30) = lVar7;
          }
          *(long *)(lVar26 + 0x18) = lVar26;
          *(long *)(lVar26 + 0x10) = lVar26;
        }
      }
      goto LAB_0014e024;
    }
  }
  else {
    uVar11 = 0xffffffffffffffff;
  }
LAB_0014df2d:
  uVar12 = *(ulong *)((long)msp + 8);
  uVar20 = uVar12 - uVar11;
  if (uVar11 <= uVar12) {
    lVar14 = *(long *)((long)msp + 0x18);
    if (uVar20 < 0x20) {
      *(ulong *)(lVar14 + 8) = uVar12 | 3;
      pbVar2 = (byte *)(lVar14 + 8 + uVar12);
      *pbVar2 = *pbVar2 | 1;
      lVar26 = 0;
      uVar20 = 0;
    }
    else {
      lVar26 = lVar14 + uVar11;
      *(ulong *)(lVar14 + 8 + uVar11) = uVar20 | 1;
      *(ulong *)(lVar14 + uVar12) = uVar20;
      *(ulong *)(lVar14 + 8) = uVar11 | 3;
    }
    *(long *)((long)msp + 0x18) = lVar26;
    *(ulong *)((long)msp + 8) = uVar20;
    goto LAB_0014e024;
  }
  uVar12 = *(ulong *)((long)msp + 0x10) - uVar11;
  if (*(ulong *)((long)msp + 0x10) < uVar11 || uVar12 == 0) {
    if (((0x1ffff < uVar11) && (uVar12 = uVar11 + 0x1036 & 0xfffffffffffff000, uVar11 < uVar12)) &&
       (pvVar8 = mmap_probe(*(PRNGState **)((long)msp + 0x360),uVar12),
       pvVar8 != (void *)0xffffffffffffffff)) {
      uVar11 = (ulong)(-(int)pvVar8 - 0x10U & 7);
      *(ulong *)((long)pvVar8 + uVar11) = uVar11 | 1;
      *(ulong *)((long)pvVar8 + uVar11 + 8) = (uVar12 - uVar11) - 0x20 | 2;
      *(undefined8 *)((long)pvVar8 + (uVar12 - uVar11) + -0x18 + uVar11) = 0xb;
      *(undefined8 *)((long)pvVar8 + (uVar12 - 0x10)) = 0;
      return (void *)((long)pvVar8 + uVar11 + 0x10);
    }
    uVar12 = uVar11 + 0x20040 & 0xfffffffffffe0000;
    if (uVar12 <= uVar11) {
      return (void *)0x0;
    }
    pvVar8 = mmap_probe(*(PRNGState **)((long)msp + 0x360),uVar12);
    if (pvVar8 == (void *)0xffffffffffffffff) {
      return (void *)0x0;
    }
    puVar1 = (ulong *)((long)msp + 0x348);
    for (puVar9 = puVar1; puVar9 != (ulong *)0x0; puVar9 = (ulong *)puVar9[2]) {
      if (pvVar8 == (void *)((long)*puVar9 + puVar9[1])) {
        pvVar4 = *(void **)((long)msp + 0x20);
        if (((void *)*puVar9 <= pvVar4) && (pvVar4 < pvVar8)) {
          puVar9[1] = puVar9[1] + uVar12;
          lVar26 = uVar12 + *(long *)((long)msp + 0x10);
          uVar20 = (ulong)(-(int)pvVar4 - 0x10U & 7);
          uVar12 = lVar26 - uVar20;
          *(ulong *)((long)msp + 0x20) = (long)pvVar4 + uVar20;
          *(ulong *)((long)msp + 0x10) = uVar12;
          *(ulong *)((long)pvVar4 + uVar20 + 8) = uVar12 | 1;
          *(undefined8 *)((long)pvVar4 + lVar26 + 8) = 0x40;
          *(undefined8 *)((long)msp + 0x28) = 0x200000;
          goto LAB_0014e3fc;
        }
        break;
      }
    }
    puVar9 = puVar1;
    while( true ) {
      if (puVar9 == (ulong *)0x0) goto LAB_0014e0a4;
      uVar20 = *puVar9;
      if (uVar20 == (long)pvVar8 + uVar12) break;
      puVar9 = (ulong *)puVar9[2];
    }
    *puVar9 = (ulong)pvVar8;
    puVar9[1] = puVar9[1] + uVar12;
    uVar23 = (ulong)(-(int)pvVar8 - 0x10U & 7);
    lVar14 = (-(int)uVar20 - 0x10U & 7) + uVar20;
    lVar26 = (long)pvVar8 + uVar11 + uVar23;
    uVar12 = lVar14 - lVar26;
    *(ulong *)((long)pvVar8 + uVar23 + 8) = uVar11 | 3;
    if (lVar14 == *(long *)((long)msp + 0x20)) {
      uVar12 = uVar12 + *(long *)((long)msp + 0x10);
      *(ulong *)((long)msp + 0x10) = uVar12;
      *(long *)((long)msp + 0x20) = lVar26;
      *(ulong *)(lVar26 + 8) = uVar12 | 1;
      goto LAB_0014e634;
    }
    if (lVar14 == *(long *)((long)msp + 0x18)) {
      uVar12 = uVar12 + *(long *)((long)msp + 8);
      *(ulong *)((long)msp + 8) = uVar12;
      *(long *)((long)msp + 0x18) = lVar26;
      *(ulong *)(lVar26 + 8) = uVar12 | 1;
      *(ulong *)(lVar26 + uVar12) = uVar12;
      goto LAB_0014e634;
    }
    uVar11 = *(ulong *)(lVar14 + 8);
    if ((uVar11 & 2) != 0) goto LAB_0014e4eb;
    uVar20 = uVar11 & 0xfffffffffffffffc;
    lVar6 = *(long *)(lVar14 + 0x18);
    if (uVar11 < 0x100) {
      lVar25 = *(long *)(lVar14 + 0x10);
      if (lVar25 == lVar6) {
        bVar21 = (byte)(uVar11 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar21 | 0xfffffffeU >> 0x20 - bVar21);
      }
      else {
        *(long *)(lVar25 + 0x18) = lVar6;
        *(long *)(lVar6 + 0x10) = lVar25;
      }
      goto LAB_0014e4e0;
    }
    lVar25 = *(long *)(lVar14 + 0x30);
    if (lVar6 != lVar14) {
      lVar7 = *(long *)(lVar14 + 0x10);
      *(long *)(lVar7 + 0x18) = lVar6;
      *(long *)(lVar6 + 0x10) = lVar7;
      goto LAB_0014e47b;
    }
    if (*(long *)(lVar14 + 0x28) != 0) {
      lVar7 = *(long *)(lVar14 + 0x28);
      puVar17 = (undefined8 *)(lVar14 + 0x28);
      goto LAB_0014e457;
    }
    if (*(long *)(lVar14 + 0x20) == 0) {
      lVar6 = 0;
    }
    else {
      lVar7 = *(long *)(lVar14 + 0x20);
      puVar17 = (undefined8 *)(lVar14 + 0x20);
LAB_0014e457:
      do {
        do {
          puVar24 = puVar17;
          lVar6 = lVar7;
          lVar7 = *(long *)(lVar6 + 0x28);
          puVar17 = (undefined8 *)(lVar6 + 0x28);
        } while (*(long *)(lVar6 + 0x28) != 0);
        lVar7 = *(long *)(lVar6 + 0x20);
        puVar17 = (undefined8 *)(lVar6 + 0x20);
      } while (*(long *)(lVar6 + 0x20) != 0);
      *puVar24 = 0;
    }
LAB_0014e47b:
    if (lVar25 != 0) {
      lVar7 = *(long *)(lVar14 + 0x38);
      if (lVar14 == *(long *)((long)msp + lVar7 * 8 + 0x248)) {
        *(long *)((long)msp + lVar7 * 8 + 0x248) = lVar6;
        if (lVar6 == 0) {
          bVar21 = (byte)lVar7 & 0x1f;
          *(uint *)((long)msp + 4) =
               *(uint *)((long)msp + 4) & (-2 << bVar21 | 0xfffffffeU >> 0x20 - bVar21);
          goto LAB_0014e4e0;
        }
      }
      else {
        *(long *)(lVar25 + 0x20 + (ulong)(*(long *)(lVar25 + 0x20) != lVar14) * 8) = lVar6;
        if (lVar6 == 0) goto LAB_0014e4e0;
      }
      *(long *)(lVar6 + 0x30) = lVar25;
      lVar25 = *(long *)(lVar14 + 0x20);
      if (lVar25 != 0) {
        *(long *)(lVar6 + 0x20) = lVar25;
        *(long *)(lVar25 + 0x30) = lVar6;
      }
      lVar25 = *(long *)(lVar14 + 0x28);
      if (lVar25 != 0) {
        *(long *)(lVar6 + 0x28) = lVar25;
        *(long *)(lVar25 + 0x30) = lVar6;
      }
    }
LAB_0014e4e0:
    uVar11 = *(ulong *)(lVar14 + 8 + uVar20);
    lVar14 = lVar14 + uVar20;
    uVar12 = uVar12 + uVar20;
LAB_0014e4eb:
    *(ulong *)(lVar14 + 8) = uVar11 & 0xfffffffffffffffe;
    *(ulong *)(lVar26 + 8) = uVar12 | 1;
    *(ulong *)(lVar26 + uVar12) = uVar12;
    if (uVar12 < 0x100) {
      uVar12 = uVar12 >> 3;
      lVar14 = (long)msp + uVar12 * 0x10 + 0x38;
      if ((*msp >> ((uint)uVar12 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar12 & 0x1f);
        lVar6 = lVar14;
      }
      else {
        lVar6 = *(long *)((long)msp + uVar12 * 0x10 + 0x48);
      }
      *(long *)((long)msp + uVar12 * 0x10 + 0x48) = lVar26;
      *(long *)(lVar6 + 0x18) = lVar26;
      *(long *)(lVar26 + 0x10) = lVar6;
      *(long *)(lVar26 + 0x18) = lVar14;
    }
    else {
      uVar15 = (uint)(uVar12 >> 8);
      if (uVar15 == 0) {
        uVar11 = 0;
      }
      else if (uVar15 < 0x10000) {
        uVar19 = 0x1f;
        if (uVar15 != 0) {
          for (; uVar15 >> uVar19 == 0; uVar19 = uVar19 - 1) {
          }
        }
        uVar11 = (ulong)((uint)((uVar12 >> ((ulong)(byte)(0x26 - (char)(uVar19 ^ 0x1f)) & 0x3f) & 1)
                               != 0) | (uVar19 ^ 0x1f) * 2 ^ 0x3e);
      }
      else {
        uVar11 = 0x1f;
      }
      plVar18 = (long *)((long)msp + uVar11 * 8 + 0x248);
      *(ulong *)(lVar26 + 0x38) = uVar11;
      *(undefined1 (*) [16])(lVar26 + 0x20) = (undefined1  [16])0x0;
      if ((*(uint *)((long)msp + 4) >> ((uint)uVar11 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar11 & 0x1f);
        *plVar18 = lVar26;
        *(long **)(lVar26 + 0x30) = plVar18;
      }
      else {
        bVar21 = 0x39 - (char)(uVar11 >> 1);
        if (uVar11 == 0x1f) {
          bVar21 = 0;
        }
        lVar6 = uVar12 << (bVar21 & 0x3f);
        lVar14 = *plVar18;
        do {
          lVar25 = lVar14;
          if ((*(ulong *)(lVar25 + 8) & 0xfffffffffffffffc) == uVar12) {
            lVar14 = *(long *)(lVar25 + 0x10);
            *(long *)(lVar14 + 0x18) = lVar26;
            *(long *)(lVar25 + 0x10) = lVar26;
            *(long *)(lVar26 + 0x10) = lVar14;
            *(long *)(lVar26 + 0x18) = lVar25;
            *(undefined8 *)(lVar26 + 0x30) = 0;
            goto LAB_0014e634;
          }
          lVar7 = lVar6 >> 0x3f;
          lVar6 = lVar6 * 2;
          lVar14 = *(long *)(lVar25 + 0x20 + lVar7 * -8);
        } while (lVar14 != 0);
        *(long *)(lVar25 + 0x20 + lVar7 * -8) = lVar26;
        *(long *)(lVar26 + 0x30) = lVar25;
      }
      *(long *)(lVar26 + 0x18) = lVar26;
      *(long *)(lVar26 + 0x10) = lVar26;
    }
LAB_0014e634:
    return (void *)((long)pvVar8 + uVar23 + 0x10);
  }
  goto LAB_0014df42;
code_r0x0014e6e3:
  plVar18 = (long *)(lVar26 + 0x28);
  goto LAB_0014e6b9;
LAB_0014e0a4:
  addr = *(undefined1 (**) [16])((long)msp + 0x20);
  pmVar10 = segment_holding((mstate)msp,(char *)addr);
  pauVar16 = (undefined1 (*) [16])(pmVar10->base + pmVar10->size);
  pauVar13 = (undefined1 (*) [16])(pauVar16[-5] + (ulong)(0x37U - (int)pauVar16 & 7) + 9);
  if ((undefined1 (*) [16])(pauVar16[-5] + (ulong)(0x37U - (int)pauVar16 & 7) + 9) < addr + 2) {
    pauVar13 = addr;
  }
  uVar20 = (ulong)(-(int)pvVar8 - 0x10U & 7);
  uVar23 = (uVar12 - 0x40) - uVar20;
  *(ulong *)((long)msp + 0x20) = (long)pvVar8 + uVar20;
  *(ulong *)((long)msp + 0x10) = uVar23;
  *(ulong *)((long)pvVar8 + uVar20 + 8) = uVar23 | 1;
  *(undefined8 *)((long)pvVar8 + (uVar12 - 0x38)) = 0x40;
  *(undefined8 *)((long)msp + 0x28) = 0x200000;
  *(undefined8 *)(*pauVar13 + 8) = 0x23;
  uVar5 = *(undefined8 *)((long)msp + 0x350);
  *(ulong *)pauVar13[1] = *puVar1;
  *(undefined8 *)(pauVar13[1] + 8) = uVar5;
  *(undefined8 *)pauVar13[2] = *(undefined8 *)((long)msp + 0x358);
  *(void **)((long)msp + 0x348) = pvVar8;
  *(ulong *)((long)msp + 0x350) = uVar12;
  *(undefined1 (**) [16])((long)msp + 0x358) = pauVar13 + 1;
  if (pauVar16 <= pauVar13 + 3) {
    pauVar16 = pauVar13 + 3;
  }
  uVar20 = (long)pauVar16 + (-0x29 - (long)pauVar13);
  auVar28._8_4_ = (int)uVar20;
  auVar28._0_8_ = uVar20;
  auVar28._12_4_ = (int)(uVar20 >> 0x20);
  uVar12 = 0;
  auVar29 = pmovsxbq(in_XMM1,0x100);
  do {
    if ((bool)(~((long)(uVar20 >> 3 | 0x8000000000000000) < (long)(uVar12 ^ 0x8000000000000000)) & 1
              )) {
      *(undefined8 *)(pauVar13[2] + uVar12 * 8 + 8) = 0xb;
    }
    auVar30._8_4_ = (int)uVar12;
    auVar30._0_8_ = uVar12;
    auVar30._12_4_ = (int)(uVar12 >> 0x20);
    if ((long)((auVar30._8_8_ | auVar29._8_8_) ^ 0x8000000000000000) <=
        (long)(auVar28._8_8_ >> 3 | 0x8000000000000000)) {
      *(undefined8 *)(pauVar13[3] + uVar12 * 8) = 0xb;
    }
    uVar12 = uVar12 + 2;
  } while (((uVar20 >> 3) + 2 & 0xfffffffffffffffe) != uVar12);
  uVar12 = (long)pauVar13 - (long)addr;
  if (uVar12 != 0) {
    (*pauVar13)[8] = (*pauVar13)[8] & 0xfe;
    *(ulong *)(*addr + 8) = uVar12 | 1;
    *(ulong *)*pauVar13 = uVar12;
    if (uVar12 < 0x100) {
      uVar12 = uVar12 >> 3;
      pauVar13 = (undefined1 (*) [16])((long)msp + uVar12 * 0x10 + 0x38);
      if ((*msp >> ((uint)uVar12 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar12 & 0x1f);
        pauVar16 = pauVar13;
      }
      else {
        pauVar16 = *(undefined1 (**) [16])((long)msp + uVar12 * 0x10 + 0x48);
      }
      *(undefined1 (**) [16])((long)msp + uVar12 * 0x10 + 0x48) = addr;
      *(undefined1 (**) [16])(pauVar16[1] + 8) = addr;
      lVar26 = 0x18;
      lVar14 = 0x10;
    }
    else {
      uVar15 = (uint)(uVar12 >> 8);
      if (uVar15 == 0) {
        uVar20 = 0;
      }
      else if (uVar15 < 0x10000) {
        uVar19 = 0x1f;
        if (uVar15 != 0) {
          for (; uVar15 >> uVar19 == 0; uVar19 = uVar19 - 1) {
          }
        }
        uVar20 = (ulong)((uint)((uVar12 >> ((ulong)(byte)(0x26 - (char)(uVar19 ^ 0x1f)) & 0x3f) & 1)
                               != 0) | (uVar19 ^ 0x1f) * 2 ^ 0x3e);
      }
      else {
        uVar20 = 0x1f;
      }
      puVar17 = (undefined8 *)((long)msp + uVar20 * 8 + 0x248);
      *(ulong *)(addr[3] + 8) = uVar20;
      addr[2] = (undefined1  [16])0x0;
      if ((*(uint *)((long)msp + 4) >> ((uint)uVar20 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar20 & 0x1f);
        *puVar17 = addr;
        *(undefined8 **)addr[3] = puVar17;
      }
      else {
        bVar21 = 0x39 - (char)(uVar20 >> 1);
        if (uVar20 == 0x1f) {
          bVar21 = 0;
        }
        lVar26 = uVar12 << (bVar21 & 0x3f);
        pauVar13 = (undefined1 (*) [16])*puVar17;
        do {
          pauVar16 = pauVar13;
          if ((*(ulong *)(*pauVar16 + 8) & 0xfffffffffffffffc) == uVar12) {
            lVar26 = *(long *)pauVar16[1];
            *(undefined1 (**) [16])(lVar26 + 0x18) = addr;
            *(undefined1 (**) [16])pauVar16[1] = addr;
            *(long *)addr[1] = lVar26;
            lVar26 = 0x30;
            lVar14 = 0x18;
            pauVar13 = (undefined1 (*) [16])0x0;
            goto LAB_0014e3f4;
          }
          lVar14 = lVar26 >> 0x3f;
          lVar26 = lVar26 * 2;
          pauVar13 = *(undefined1 (**) [16])((long)pauVar16 + lVar14 * -8 + 0x20);
        } while (pauVar13 != (undefined1 (*) [16])0x0);
        *(undefined1 (**) [16])((long)pauVar16 + lVar14 * -8 + 0x20) = addr;
        *(undefined1 (**) [16])addr[3] = pauVar16;
      }
      lVar26 = 0x10;
      lVar14 = 0x18;
      pauVar16 = addr;
      pauVar13 = addr;
    }
LAB_0014e3f4:
    *(undefined1 (**) [16])(*addr + lVar14) = pauVar16;
    *(undefined1 (**) [16])(*addr + lVar26) = pauVar13;
  }
LAB_0014e3fc:
  uVar12 = *(ulong *)((long)msp + 0x10) - uVar11;
  if (*(ulong *)((long)msp + 0x10) < uVar11 || uVar12 == 0) {
    return (void *)0x0;
  }
LAB_0014df42:
  *(ulong *)((long)msp + 0x10) = uVar12;
  lVar14 = *(long *)((long)msp + 0x20);
  *(ulong *)((long)msp + 0x20) = lVar14 + uVar11;
  *(ulong *)(lVar14 + 8 + uVar11) = uVar12 | 1;
  *(ulong *)(lVar14 + 8) = uVar11 | 3;
LAB_0014e024:
  return (void *)(lVar14 + 0x10);
}

Assistant:

static LJ_NOINLINE void *lj_alloc_malloc(void *msp, size_t nsize)
{
  mstate ms = (mstate)msp;
  void *mem;
  size_t nb;
  if (nsize <= MAX_SMALL_REQUEST) {
    bindex_t idx;
    binmap_t smallbits;
    nb = (nsize < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(nsize);
    idx = small_index(nb);
    smallbits = ms->smallmap >> idx;

    if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
      mchunkptr b, p;
      idx += ~smallbits & 1;       /* Uses next bin if idx empty */
      b = smallbin_at(ms, idx);
      p = b->fd;
      unlink_first_small_chunk(ms, b, p, idx);
      set_inuse_and_pinuse(ms, p, small_index2size(idx));
      mem = chunk2mem(p);
      return mem;
    } else if (nb > ms->dvsize) {
      if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
	mchunkptr b, p, r;
	size_t rsize;
	binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
	bindex_t i = lj_ffs(leftbits);
	b = smallbin_at(ms, i);
	p = b->fd;
	unlink_first_small_chunk(ms, b, p, i);
	rsize = small_index2size(i) - nb;
	/* Fit here cannot be remainderless if 4byte sizes */
	if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE) {
	  set_inuse_and_pinuse(ms, p, small_index2size(i));
	} else {
	  set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
	  r = chunk_plus_offset(p, nb);
	  set_size_and_pinuse_of_free_chunk(r, rsize);
	  replace_dv(ms, r, rsize);
	}
	mem = chunk2mem(p);
	return mem;
      } else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
	return mem;
      }
    }
  } else if (nsize >= MAX_REQUEST) {
    nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
  } else {
    nb = pad_request(nsize);
    if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
      return mem;
    }
  }

  if (nb <= ms->dvsize) {
    size_t rsize = ms->dvsize - nb;
    mchunkptr p = ms->dv;
    if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
      mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
      ms->dvsize = rsize;
      set_size_and_pinuse_of_free_chunk(r, rsize);
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    } else { /* exhaust dv */
      size_t dvs = ms->dvsize;
      ms->dvsize = 0;
      ms->dv = 0;
      set_inuse_and_pinuse(ms, p, dvs);
    }
    mem = chunk2mem(p);
    return mem;
  } else if (nb < ms->topsize) { /* Split top */
    size_t rsize = ms->topsize -= nb;
    mchunkptr p = ms->top;
    mchunkptr r = ms->top = chunk_plus_offset(p, nb);
    r->head = rsize | PINUSE_BIT;
    set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    mem = chunk2mem(p);
    return mem;
  }
  return alloc_sys(ms, nb);
}